

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void google::protobuf::MessageFactory::InternalRegisterGeneratedFile(DescriptorTable *table)

{
  DescriptorTable *in_stack_00000058;
  GeneratedMessageFactory *in_stack_00000060;
  
  anon_unknown_0::GeneratedMessageFactory::singleton();
  anon_unknown_0::GeneratedMessageFactory::RegisterFile(in_stack_00000060,in_stack_00000058);
  return;
}

Assistant:

void MessageFactory::InternalRegisterGeneratedFile(
    const google::protobuf::internal::DescriptorTable* table) {
  GeneratedMessageFactory::singleton()->RegisterFile(table);
}